

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void aom_dc_predictor_64x16_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint8_t uVar3;
  int iVar4;
  uint8_t *puVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  
  auVar7 = in_ZMM0._0_16_;
  dc_sum_64(above);
  auVar1 = vpsadbw_avx((undefined1  [16])0x0,*(undefined1 (*) [16])left);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpaddw_avx(auVar1,auVar7);
  auVar1 = vpaddw_avx(auVar2,auVar1);
  uVar3 = (uint8_t)((auVar1._0_4_ + 0x28U & 0xffff) / 0x50);
  puVar5 = dst + 0x20;
  iVar4 = 0x10;
  while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
    puVar5[-0x20] = uVar3;
    puVar5[-0x1f] = uVar3;
    puVar5[-0x1e] = uVar3;
    puVar5[-0x1d] = uVar3;
    puVar5[-0x1c] = uVar3;
    puVar5[-0x1b] = uVar3;
    puVar5[-0x1a] = uVar3;
    puVar5[-0x19] = uVar3;
    puVar5[-0x18] = uVar3;
    puVar5[-0x17] = uVar3;
    puVar5[-0x16] = uVar3;
    puVar5[-0x15] = uVar3;
    puVar5[-0x14] = uVar3;
    puVar5[-0x13] = uVar3;
    puVar5[-0x12] = uVar3;
    puVar5[-0x11] = uVar3;
    puVar5[-0x10] = uVar3;
    puVar5[-0xf] = uVar3;
    puVar5[-0xe] = uVar3;
    puVar5[-0xd] = uVar3;
    puVar5[-0xc] = uVar3;
    puVar5[-0xb] = uVar3;
    puVar5[-10] = uVar3;
    puVar5[-9] = uVar3;
    puVar5[-8] = uVar3;
    puVar5[-7] = uVar3;
    puVar5[-6] = uVar3;
    puVar5[-5] = uVar3;
    puVar5[-4] = uVar3;
    puVar5[-3] = uVar3;
    puVar5[-2] = uVar3;
    puVar5[-1] = uVar3;
    *puVar5 = uVar3;
    puVar5[1] = uVar3;
    puVar5[2] = uVar3;
    puVar5[3] = uVar3;
    puVar5[4] = uVar3;
    puVar5[5] = uVar3;
    puVar5[6] = uVar3;
    puVar5[7] = uVar3;
    puVar5[8] = uVar3;
    puVar5[9] = uVar3;
    puVar5[10] = uVar3;
    puVar5[0xb] = uVar3;
    puVar5[0xc] = uVar3;
    puVar5[0xd] = uVar3;
    puVar5[0xe] = uVar3;
    puVar5[0xf] = uVar3;
    puVar5[0x10] = uVar3;
    puVar5[0x11] = uVar3;
    puVar5[0x12] = uVar3;
    puVar5[0x13] = uVar3;
    puVar5[0x14] = uVar3;
    puVar5[0x15] = uVar3;
    puVar5[0x16] = uVar3;
    puVar5[0x17] = uVar3;
    puVar5[0x18] = uVar3;
    puVar5[0x19] = uVar3;
    puVar5[0x1a] = uVar3;
    puVar5[0x1b] = uVar3;
    puVar5[0x1c] = uVar3;
    puVar5[0x1d] = uVar3;
    puVar5[0x1e] = uVar3;
    puVar5[0x1f] = uVar3;
    puVar5 = puVar5 + stride;
  }
  return;
}

Assistant:

void aom_dc_predictor_64x16_avx2(uint8_t *dst, ptrdiff_t stride,
                                 const uint8_t *above, const uint8_t *left) {
  const __m256i sum_above = dc_sum_64(above);
  __m256i sum_left = _mm256_castsi128_si256(dc_sum_16_sse2(left));
  sum_left = _mm256_add_epi16(sum_left, sum_above);
  uint16_t sum = (uint16_t)_mm_cvtsi128_si32(_mm256_castsi256_si128(sum_left));
  sum += 40;
  sum /= 80;
  const __m256i row = _mm256_set1_epi8((int8_t)sum);
  row_store_64xh(&row, 16, dst, stride);
}